

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O2

void __thiscall msgpack11::MsgPack::MsgPack(MsgPack *this,array *values)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  pointer local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::
  make_shared<msgpack11::MsgPackArray,std::vector<msgpack11::MsgPack,std::allocator<msgpack11::MsgPack>>const&>
            ((vector<msgpack11::MsgPack,_std::allocator<msgpack11::MsgPack>_> *)&local_18);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_ptr).super___shared_ptr<msgpack11::MsgPackValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_18;
  (this->m_ptr).super___shared_ptr<msgpack11::MsgPackValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  local_18 = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  return;
}

Assistant:

MsgPack::MsgPack(const MsgPack::array &values)     : m_ptr(make_shared<MsgPackArray>(values)) {}